

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

void FIX::socket_init(void)

{
  sigaction sa;
  
  sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
  return;
}

Assistant:

void socket_init() {
#ifdef _MSC_VER
  WORD version = MAKEWORD(2, 2);
  WSADATA data;
  WSAStartup(version, &data);
#else
  struct sigaction sa;
  sa.sa_handler = SIG_IGN;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(SIGPIPE, &sa, 0);
#endif
}